

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

void duckdb::SchemaDiscovery
               (ClientContext *context,ReadCSVData *result,CSVReaderOptions *options,
               MultiFileOptions *file_options,vector<duckdb::LogicalType,_true> *return_types,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *names,MultiFileList *multi_file_list)

{
  CSVSchema *this;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *__ht;
  pointer pLVar1;
  element_type *peVar2;
  pointer pLVar3;
  undefined8 uVar4;
  ReadCSVData *pRVar5;
  bool bVar6;
  CSVStateMachineCache *pCVar7;
  idx_t iVar8;
  const_reference __args_2;
  CSVBufferManager *pCVar9;
  CSVBufferHandle *pCVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  element_type *peVar12;
  idx_t iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined1 *puVar15;
  pointer pcVar16;
  pointer pCVar17;
  CSVBufferManager *__tmp;
  undefined1 *__n;
  LogicalType *type;
  pointer pLVar18;
  idx_t rows_read;
  vector<duckdb::CSVSchema,_true> schemas;
  SnifferResult sniffer_result_1;
  vector<duckdb::OpenFileInfo,_true> file_paths;
  idx_t rows_read_1;
  CSVSchema best_schema;
  SnifferResult sniffer_result;
  CSVReaderOptions option_og;
  shared_ptr<duckdb::CSVBufferManager,_true> local_bd8;
  undefined1 local_bc8 [24];
  element_type *local_bb0;
  undefined1 local_ba8 [32];
  element_type *local_b88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b80;
  CSVReaderOptions *local_b78;
  MultiFileOptions *local_b70;
  undefined1 local_b68 [56];
  undefined1 local_b30 [40];
  ReadCSVData *local_b08;
  element_type *local_b00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_af8;
  __node_base local_af0;
  undefined1 local_ae8 [72];
  __node_base_ptr p_Stack_aa0;
  _Alloc_hider local_a98;
  __node_base local_a90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a88;
  undefined8 local_a78;
  bool local_a70;
  idx_t local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [13];
  undefined1 local_6d8 [672];
  CSVReaderOptions local_438;
  
  local_ba8._0_8_ = (pointer)0x0;
  local_ba8._8_8_ = (pointer)0x0;
  local_ba8._16_8_ = 0;
  local_b88 = (element_type *)return_types;
  local_b70 = file_options;
  CSVReaderOptions::CSVReaderOptions(&local_438,options);
  (*multi_file_list->_vptr_MultiFileList[4])(local_b30);
  iVar13 = options->sample_size_chunks;
  vector<duckdb::OpenFileInfo,_true>::operator[]((vector<duckdb::OpenFileInfo,_true> *)local_b30,0);
  ::std::__cxx11::string::_M_assign((string *)&options->file_path);
  local_b68._0_8_ = local_b68._0_8_ & 0xffffffffffffff00;
  local_ae8._0_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVBufferManager,std::allocator<duckdb::CSVBufferManager>,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_ae8 + 8),
             (CSVBufferManager **)local_ae8,(allocator<duckdb::CSVBufferManager> *)local_6d8,context
             ,options,&options->file_path,(bool *)local_b68);
  local_b30._24_8_ = local_ae8._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_ae8._8_8_ + 8) = *(_Atomic_word *)(local_ae8._8_8_ + 8) + 1;
      UNLOCK();
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00b9eaee;
    }
    else {
      *(_Atomic_word *)(local_ae8._8_8_ + 8) = *(_Atomic_word *)(local_ae8._8_8_ + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_);
  }
LAB_00b9eaee:
  (result->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b30._24_8_;
  p_Var11 = (result->buffer_manager).internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (result->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    local_b30._24_8_ =
         (result->buffer_manager).internal.
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_ae8._8_8_ =
         (result->buffer_manager).internal.
         super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ae8._8_8_)->_M_use_count + 1;
    }
  }
  local_b30._32_8_ = local_ae8._8_8_;
  pCVar7 = CSVStateMachineCache::Get(context);
  CSVSniffer::CSVSniffer
            ((CSVSniffer *)local_ae8,options,local_b70,
             (shared_ptr<duckdb::CSVBufferManager,_true> *)(local_b30 + 0x18),pCVar7,true);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b30._32_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b30._32_8_);
  }
  CSVSniffer::SniffCSV((SnifferResult *)local_6d8,(CSVSniffer *)local_ae8,false);
  iVar8 = CSVSniffer::LinesSniffed((CSVSniffer *)local_ae8);
  local_bd8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         (iVar8 - ((ulong)(options->dialect_options).header.value +
                  (options->dialect_options).skip_rows.value));
  __args_2 = vector<duckdb::OpenFileInfo,_true>::operator[]
                       ((vector<duckdb::OpenFileInfo,_true> *)local_b30,0);
  pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&result->buffer_manager);
  CSVBufferManager::GetBuffer((CSVBufferManager *)local_b68,(idx_t)pCVar9);
  pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                      ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_b68);
  local_bc8[0] = pCVar10->actual_size == 0;
  ::std::vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>>::
  emplace_back<duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,std::__cxx11::string_const&,unsigned_long&,bool>
            ((vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>> *)local_ba8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)(local_6d8 + 0x18),(vector<duckdb::LogicalType,_true> *)local_6d8,&__args_2->path,
             (unsigned_long *)&local_bd8,(bool *)local_bc8);
  if ((ClientContext *)local_b68._8_8_ != (ClientContext *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b68._8_8_);
  }
  p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CSVSniffer::LinesSniffed((CSVSniffer *)local_ae8);
  bVar6 = CSVSniffer::EmptyOrOnlyHeader((CSVSniffer *)local_ae8);
  p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iVar13 << 0xb);
  puVar15 = (undefined1 *)(ulong)bVar6;
  local_b80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)names;
  local_b78 = options;
  local_b08 = result;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_6d8 + 0x18));
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_6d8);
  CSVSniffer::~CSVSniffer((CSVSniffer *)local_ae8);
  peVar12 = (element_type *)(((long)(local_b30._8_8_ - local_b30._0_8_) >> 4) * -0x5555555555555555)
  ;
  local_b00 = (element_type *)0xa;
  if (peVar12 < (element_type *)0xa) {
    local_b00 = peVar12;
  }
  __n = &DAT_00000001;
  local_af8._M_pi = p_Var14;
  if ((p_Var11 < p_Var14) && ((element_type *)&DAT_00000001 < peVar12)) {
    do {
      CSVReaderOptions::CSVReaderOptions((CSVReaderOptions *)local_ae8,&local_438);
      vector<duckdb::OpenFileInfo,_true>::operator[]
                ((vector<duckdb::OpenFileInfo,_true> *)local_b30,(size_type)__n);
      ::std::__cxx11::string::_M_assign((string *)local_878);
      local_bc8[0] = false;
      local_6d8._0_8_ = (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::CSVBufferManager,std::allocator<duckdb::CSVBufferManager>,duckdb::ClientContext&,duckdb::CSVReaderOptions&,std::__cxx11::string&,bool>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d8 + 8),
                 (CSVBufferManager **)local_6d8,(allocator<duckdb::CSVBufferManager> *)local_b68,
                 context,(CSVReaderOptions *)local_ae8,local_878,(bool *)local_bc8);
      local_bd8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_6d8._0_8_;
      local_bd8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._8_8_;
      if ((element_type *)local_6d8._8_8_ == (element_type *)0x0) {
        local_bc8._16_8_ = local_6d8._0_8_;
        local_bb0 = (element_type *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_6d8._8_8_ + 8) = *(int *)(local_6d8._8_8_ + 8) + 1;
          UNLOCK();
          if ((element_type *)local_6d8._8_8_ != (element_type *)0x0) goto LAB_00b9edd0;
        }
        else {
          *(int *)(local_6d8._8_8_ + 8) = *(int *)(local_6d8._8_8_ + 8) + 1;
LAB_00b9edd0:
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._8_8_);
        }
        local_bc8._16_8_ =
             local_bd8.internal.
             super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_bb0 = (element_type *)
                    local_bd8.internal.
                    super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
        if ((element_type *)
            local_bd8.internal.
            super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_bd8.internal.
             super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_bd8.internal.
                  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_bd8.internal.
             super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_bd8.internal.
                  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      local_bd8.internal.super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_bc8._16_8_;
      pCVar7 = CSVStateMachineCache::Get(context);
      CSVSniffer::CSVSniffer
                ((CSVSniffer *)local_6d8,(CSVReaderOptions *)local_ae8,local_b70,
                 (shared_ptr<duckdb::CSVBufferManager,_true> *)(local_bc8 + 0x10),pCVar7,true);
      if (local_bb0 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_bb0);
      }
      CSVSniffer::SniffCSV((SnifferResult *)local_b68,(CSVSniffer *)local_6d8,false);
      iVar13 = CSVSniffer::LinesSniffed((CSVSniffer *)local_6d8);
      local_af0._M_nxt =
           (_Hash_node_base *)(iVar13 - (((ulong)local_ae8._64_8_ >> 8 & 0xff) + local_a68));
      pCVar9 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->(&local_bd8);
      CSVBufferManager::GetBuffer((CSVBufferManager *)local_bc8,(idx_t)pCVar9);
      pCVar10 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                          ((shared_ptr<duckdb::CSVBufferHandle,_true> *)local_bc8);
      iVar13 = pCVar10->actual_size;
      if ((ClientContext *)local_bc8._8_8_ != (ClientContext *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_bc8._8_8_);
      }
      if (iVar13 == 0) {
        local_bc8[0] = true;
        ::std::vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>::emplace_back<bool>
                  ((vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_> *)local_ba8,
                   (bool *)local_bc8);
      }
      else {
        ::std::vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>>::
        emplace_back<duckdb::vector<std::__cxx11::string,true>&,duckdb::vector<duckdb::LogicalType,true>&,std::__cxx11::string&,unsigned_long&>
                  ((vector<duckdb::CSVSchema,std::allocator<duckdb::CSVSchema>> *)local_ba8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)(local_b68 + 0x18),(vector<duckdb::LogicalType,_true> *)local_b68,local_878,
                   (unsigned_long *)&local_af0);
      }
      iVar13 = CSVSniffer::LinesSniffed((CSVSniffer *)local_6d8);
      bVar6 = CSVSniffer::EmptyOrOnlyHeader((CSVSniffer *)local_6d8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_b68 + 0x18));
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_b68);
      CSVSniffer::~CSVSniffer((CSVSniffer *)local_6d8);
      if ((element_type *)
          local_bd8.internal.
          super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_bd8.internal.
                   super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&p_Var11->_vptr__Sp_counted_base + iVar13);
      puVar15 = puVar15 + bVar6;
      __n = __n + 1;
      CSVReaderOptions::~CSVReaderOptions((CSVReaderOptions *)local_ae8);
    } while ((p_Var11 < local_af8._M_pi) && (__n < local_b00));
  }
  uVar4 = local_ba8._8_8_;
  __ht = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)(local_ae8 + 0x18);
  local_ae8._0_8_ = (CSVBufferManager *)0x0;
  local_ae8._8_8_ = (pointer)0x0;
  local_ae8._16_8_ = (pointer)0x0;
  local_ae8._24_8_ = &p_Stack_aa0;
  local_ae8._32_8_ = 1;
  local_ae8._40_8_ = (pointer)0x0;
  local_ae8._48_8_ = (__pthread_internal_list *)0x0;
  local_ae8._56_4_ = 0x3f800000;
  local_ae8._64_8_ = 0;
  p_Stack_aa0 = (__node_base_ptr)0x0;
  local_a98._M_p = (pointer)&local_a88;
  local_a90._M_nxt = (_Hash_node_base *)0x0;
  local_a88._M_local_buf[0] = '\0';
  local_a78 = 0;
  local_a70 = false;
  if (local_ba8._0_8_ != local_ba8._8_8_) {
    pcVar16 = (pointer)(local_ba8._0_8_ + 0x50);
    do {
      bVar6 = CSVSchema::Empty((CSVSchema *)local_ae8);
      this = (CSVSchema *)(pcVar16 + -0x50);
      if (bVar6) {
        ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::operator=
                  ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)
                   local_ae8,
                   (vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)this);
LAB_00b9f046:
        if (this != (CSVSchema *)local_ae8) {
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)__ht,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)(pcVar16 + -0x38));
        }
        ::std::__cxx11::string::_M_assign((string *)&local_a98);
        local_a70 = (bool)pcVar16[0x28];
        local_a78 = *(undefined8 *)(pcVar16 + 0x20);
      }
      else {
        iVar13 = CSVSchema::GetRowsRead((CSVSchema *)local_ae8);
        if (iVar13 == 0) {
          ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::operator=
                    ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)
                     local_ae8,
                     (vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)this);
          goto LAB_00b9f046;
        }
        iVar13 = CSVSchema::GetRowsRead(this);
        if (iVar13 != 0) {
          CSVSchema::MergeSchemas((CSVSchema *)local_ae8,this,local_b78->null_padding);
        }
      }
      pCVar17 = (pointer)(pcVar16 + 0x30);
      pcVar16 = pcVar16 + 0x80;
    } while (pCVar17 != (pointer)uVar4);
  }
  if ((((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&(local_b80._M_pi)->_vptr__Sp_counted_base)->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start == *(pointer *)&(local_b80._M_pi)->_M_use_count) {
    CSVSchema::GetNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_b68,(CSVSchema *)local_ae8);
    local_6d8._16_8_ = local_b80._M_pi[1]._vptr__Sp_counted_base;
    local_b80._M_pi[1]._vptr__Sp_counted_base = (_func_int **)local_b68._16_8_;
    local_6d8._0_8_ =
         (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&(local_b80._M_pi)->_vptr__Sp_counted_base)->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_6d8._8_8_ = *(undefined8 *)&(local_b80._M_pi)->_M_use_count;
    (((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)&(local_b80._M_pi)->_vptr__Sp_counted_base)->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_b68._0_8_;
    *(undefined8 *)&(local_b80._M_pi)->_M_use_count = local_b68._8_8_;
    local_b68._0_8_ =
         (tuple<duckdb::CSVFileHandle_*,_std::default_delete<duckdb::CSVFileHandle>_>)0x0;
    local_b68._8_8_ = (ClientContext *)0x0;
    local_b68._16_8_ = (pointer)0x0;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_6d8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b68);
    CSVSchema::GetTypes((vector<duckdb::LogicalType,_true> *)local_b68,(CSVSchema *)local_ae8);
    local_6d8._16_8_ = (local_b88->options)._M_h._M_before_begin._M_nxt;
    (local_b88->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_b68._16_8_;
    local_6d8._0_8_ =
         (((_Vector_impl *)&(local_b88->options)._M_h._M_buckets)->super__Vector_impl_data)._M_start
    ;
    local_6d8._8_8_ = (local_b88->options)._M_h._M_bucket_count;
    (((_Vector_impl *)&(local_b88->options)._M_h._M_buckets)->super__Vector_impl_data)._M_start =
         (pointer)local_b68._0_8_;
    (local_b88->options)._M_h._M_bucket_count = local_b68._8_8_;
    local_b68._0_8_ = (_Head_base<0UL,_duckdb::CSVFileHandle_*,_false>)0x0;
    local_b68._8_8_ = (ClientContext *)0x0;
    local_b68._16_8_ = (pointer)0x0;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_6d8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_b68);
  }
  pRVar5 = local_b08;
  if ((puVar15 == __n) && (local_b78->columns_set == false)) {
    pLVar18 = (((_Vector_impl *)&(local_b88->options)._M_h._M_buckets)->super__Vector_impl_data).
              _M_start;
    pLVar1 = (pointer)(local_b88->options)._M_h._M_bucket_count;
    if (pLVar18 != pLVar1) {
      do {
        LogicalType::LogicalType((LogicalType *)local_6d8,VARCHAR);
        pLVar18->id_ = (LogicalTypeId)local_6d8[0];
        pLVar18->physical_type_ = local_6d8[1];
        peVar2 = (pLVar18->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        pLVar3 = (pointer)(pLVar18->type_info_).internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
        (pLVar18->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_6d8._8_8_;
        (pLVar18->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_6d8._16_8_;
        local_6d8._8_8_ = peVar2;
        local_6d8._16_8_ = pLVar3;
        LogicalType::~LogicalType((LogicalType *)local_6d8);
        pLVar18 = pLVar18 + 1;
      } while (pLVar18 != pLVar1);
    }
  }
  ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::operator=
            ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)
             &pRVar5->csv_schema,
             (vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)local_ae8);
  if ((CSVSchema *)local_ae8 != &pRVar5->csv_schema) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(pRVar5->csv_schema).name_idx_map,__ht);
  }
  ::std::__cxx11::string::_M_assign((string *)&(pRVar5->csv_schema).file_path);
  (pRVar5->csv_schema).empty = local_a70;
  (pRVar5->csv_schema).rows_read = local_a78;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_p != &local_a88) {
    operator_delete(local_a98._M_p);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(__ht);
  ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::~vector
            ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)local_ae8);
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_b30);
  CSVReaderOptions::~CSVReaderOptions(&local_438);
  ::std::vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_>::~vector
            ((vector<duckdb::CSVSchema,_std::allocator<duckdb::CSVSchema>_> *)local_ba8);
  return;
}

Assistant:

void SchemaDiscovery(ClientContext &context, ReadCSVData &result, CSVReaderOptions &options,
                     const MultiFileOptions &file_options, vector<LogicalType> &return_types, vector<string> &names,
                     MultiFileList &multi_file_list) {
	vector<CSVSchema> schemas;
	const auto option_og = options;

	const auto file_paths = multi_file_list.GetAllFiles();

	// Here what we want to do is to sniff a given number of lines, if we have many files, we might go through them
	// to reach the number of lines.
	const idx_t required_number_of_lines = options.sniff_size * options.sample_size_chunks;

	idx_t total_number_of_rows = 0;
	idx_t current_file = 0;
	options.file_path = file_paths[current_file].path;

	result.buffer_manager = make_shared_ptr<CSVBufferManager>(context, options, options.file_path, false);
	idx_t only_header_or_empty_files = 0;

	{
		CSVSniffer sniffer(options, file_options, result.buffer_manager, CSVStateMachineCache::Get(context));
		auto sniffer_result = sniffer.SniffCSV();
		idx_t rows_read = sniffer.LinesSniffed() -
		                  (options.dialect_options.skip_rows.GetValue() + options.dialect_options.header.GetValue());

		schemas.emplace_back(sniffer_result.names, sniffer_result.return_types, file_paths[0].path, rows_read,
		                     result.buffer_manager->GetBuffer(0)->actual_size == 0);
		total_number_of_rows += sniffer.LinesSniffed();
		current_file++;
		if (sniffer.EmptyOrOnlyHeader()) {
			only_header_or_empty_files++;
		}
	}

	// We do a copy of the options to not pollute the options of the first file.
	constexpr idx_t max_files_to_sniff = 10;
	idx_t files_to_sniff = file_paths.size() > max_files_to_sniff ? max_files_to_sniff : file_paths.size();
	while (total_number_of_rows < required_number_of_lines && current_file < files_to_sniff) {
		auto option_copy = option_og;
		option_copy.file_path = file_paths[current_file].path;
		auto buffer_manager = make_shared_ptr<CSVBufferManager>(context, option_copy, option_copy.file_path, false);
		// TODO: We could cache the sniffer to be reused during scanning. Currently that's an exercise left to the
		// reader
		CSVSniffer sniffer(option_copy, file_options, buffer_manager, CSVStateMachineCache::Get(context));
		auto sniffer_result = sniffer.SniffCSV();
		idx_t rows_read = sniffer.LinesSniffed() - (option_copy.dialect_options.skip_rows.GetValue() +
		                                            option_copy.dialect_options.header.GetValue());
		if (buffer_manager->GetBuffer(0)->actual_size == 0) {
			schemas.emplace_back(true);
		} else {
			schemas.emplace_back(sniffer_result.names, sniffer_result.return_types, option_copy.file_path, rows_read);
		}
		total_number_of_rows += sniffer.LinesSniffed();
		if (sniffer.EmptyOrOnlyHeader()) {
			only_header_or_empty_files++;
		}
		current_file++;
	}

	// We might now have multiple schemas, we need to go through them to define the one true schema
	CSVSchema best_schema;
	for (auto &schema : schemas) {
		if (best_schema.Empty()) {
			// A schema is bettah than no schema
			best_schema = schema;
		} else if (best_schema.GetRowsRead() == 0) {
			// If the best-schema has no data-rows, that's easy, we just take the new schema
			best_schema = schema;
		} else if (schema.GetRowsRead() != 0) {
			// We might have conflicting-schemas, we must merge them
			best_schema.MergeSchemas(schema, options.null_padding);
		}
	}

	if (names.empty()) {
		names = best_schema.GetNames();
		return_types = best_schema.GetTypes();
	}
	if (only_header_or_empty_files == current_file && !options.columns_set) {
		for (auto &type : return_types) {
			D_ASSERT(type.id() == LogicalTypeId::BOOLEAN);
			// we default to varchar if all files are empty or only have a header after all the sniffing
			type = LogicalType::VARCHAR;
		}
	}
	result.csv_schema = best_schema;
}